

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void fix_bind(xr_bone *bone)

{
  bool bVar1;
  xr_bone_vec *pxVar2;
  reference ppxVar3;
  fvector3 *pfVar4;
  xr_bone *pxVar5;
  undefined1 local_1a0 [8];
  fmatrix local_i;
  fmatrix total_i;
  fmatrix parent_i;
  fmatrix local;
  fmatrix parent;
  fmatrix total;
  xr_bone_vec_it end;
  xr_bone_vec_it it;
  xr_bone *bone_local;
  
  pxVar2 = xray_re::xr_bone::children(bone);
  end._M_current =
       (xr_bone **)
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::begin(pxVar2);
  pxVar2 = xray_re::xr_bone::children(bone);
  total.field_0._56_8_ =
       std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::end(pxVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
                             *)((long)&total.field_0.field_1.c.field_0 + 8));
    if (!bVar1) break;
    ppxVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
              ::operator*(&end);
    fix_bind(*ppxVar3);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_bone_**,_std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>_>
    ::operator++(&end);
  }
  bVar1 = xray_re::xr_bone::is_root(bone);
  if (!bVar1) {
    pfVar4 = xray_re::xr_bone::bind_rotate(bone);
    xray_re::_matrix<float>::set_xyz_i
              ((_matrix<float> *)((long)&parent.field_0.field_1.c.field_0 + 8),pfVar4);
    pfVar4 = xray_re::xr_bone::bind_offset(bone);
    xray_re::_vector3<float>::set<float>
              ((_vector3<float> *)((long)&total.field_0.field_1.k.field_0 + 8),pfVar4);
    pxVar5 = xray_re::xr_bone::parent(bone);
    pfVar4 = xray_re::xr_bone::bind_rotate(pxVar5);
    xray_re::_matrix<float>::set_xyz_i
              ((_matrix<float> *)((long)&local.field_0.field_1.c.field_0 + 8),pfVar4);
    pxVar5 = xray_re::xr_bone::parent(bone);
    pfVar4 = xray_re::xr_bone::bind_offset(pxVar5);
    xray_re::_vector3<float>::set<float>
              ((_vector3<float> *)((long)&parent.field_0.field_1.k.field_0 + 8),pfVar4);
    xray_re::_matrix<float>::invert_43
              ((_matrix<float> *)((long)&total_i.field_0.field_1.c.field_0 + 8),
               (_matrix<float> *)((long)&local.field_0.field_1.c.field_0 + 8));
    xray_re::_matrix<float>::invert_43
              ((_matrix<float> *)((long)&local_i.field_0.field_1.c.field_0 + 8),
               (_matrix<float> *)((long)&parent.field_0.field_1.c.field_0 + 8));
    xray_re::_matrix<float>::mul_43
              ((_matrix<float> *)((long)&parent_i.field_0.field_1.c.field_0 + 8),
               (_matrix<float> *)((long)&local_i.field_0.field_1.c.field_0 + 8),
               (_matrix<float> *)((long)&local.field_0.field_1.c.field_0 + 8));
    xray_re::_matrix<float>::invert_43
              ((_matrix<float> *)local_1a0,
               (_matrix<float> *)((long)&parent_i.field_0.field_1.c.field_0 + 8));
    pfVar4 = xray_re::xr_bone::bind_offset(bone);
    *(undefined8 *)&pfVar4->field_0 = local_i.field_0._40_8_;
    (pfVar4->field_0).field_0.z = local_i.field_0.field_0._41;
    pfVar4 = xray_re::xr_bone::bind_rotate(bone);
    xray_re::_matrix<float>::get_xyz_i((_matrix<float> *)local_1a0,pfVar4);
  }
  return;
}

Assistant:

void fix_bind(xr_bone * bone)
{
	for (xr_bone_vec_it it = bone->children().begin(), end = bone->children().end(); it != end; ++it)
		fix_bind(*it);

	if (!bone->is_root())
	{
		fmatrix total, parent, local, parent_i, total_i, local_i;
		total.set_xyz_i(bone->bind_rotate());
		total.c.set(bone->bind_offset());
		parent.set_xyz_i(bone->parent()->bind_rotate());
		parent.c.set(bone->parent()->bind_offset());
		parent_i.invert_43(parent);
		total_i.invert_43(total);
		local.mul_43(total_i, parent);
		local_i.invert_43(local);

		bone->bind_offset() = local_i.c;
		local_i.get_xyz_i(bone->bind_rotate());
	}
}